

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O1

ostream * tcb::operator<<(ostream *os,rational<unsigned_int> *r)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  std::ostream::_M_insert<unsigned_long>((ulong)os);
  if (r->denom_ != 1) {
    uStack_18 = CONCAT17(0x2f,(undefined7)uStack_18);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_18 + 7),1)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const rational<T>& r)
{
    os << r.num();
    if (r.denom() != 1) {
        os << '/' << r.denom();
    }
    return os;
}